

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int update_traffic_key_cb
              (ptls_update_traffic_key_t *self,ptls_t *tls,int is_enc,size_t epoch,void *secret)

{
  anon_struct_24_3_7a07e5ce_for_new_token *paVar1;
  quicly_conn_t *conn;
  char *pcVar2;
  st_quicly_handshake_space_t *psVar3;
  ptls_aead_context_t *ctx;
  st_quicly_crypto_engine_t *psVar4;
  quicly_context_t *pqVar5;
  ulong uVar6;
  anon_struct_112_4_eef7ff01_for_ingress *paVar7;
  int iVar8;
  int iVar9;
  void **ppvVar10;
  ptls_context_t *ppVar11;
  ptls_cipher_suite_t *ppVar12;
  st_quicly_application_space_t *psVar13;
  uint8_t *puVar14;
  size_t size;
  anon_struct_216_2_55ab8ea6_for_cipher *paVar15;
  anon_struct_104_4_e718f752_for_egress *paVar16;
  char hexbuf [129];
  char local_b8 [136];
  
  ppvVar10 = ptls_get_data_ptr(tls);
  conn = (quicly_conn_t *)*ppvVar10;
  ppVar11 = ptls_get_context(tls);
  ppVar12 = ptls_get_cipher(tls);
  iVar8 = ptls_is_server(tls);
  if (ppVar11->log_event != (ptls_log_event_t *)0x0) {
    pcVar2 = update_traffic_key_cb::log_labels[iVar8 == is_enc][epoch];
    ptls_hexdump(local_b8,secret,ppVar12->hash->digest_size);
    (*ppVar11->log_event->cb)(ppVar11->log_event,tls,pcVar2,"%s",local_b8);
  }
  if (epoch == 3) {
    if ((is_enc != 0) && (iVar8 = apply_remote_transport_params(conn), iVar8 != 0)) {
      return iVar8;
    }
    if ((conn->application == (st_quicly_application_space_t *)0x0) &&
       (iVar8 = setup_application_space(conn), iVar8 != 0)) {
      return iVar8;
    }
    psVar13 = conn->application;
    if (is_enc == 0) {
      paVar7 = &(psVar13->cipher).ingress;
      paVar16 = (anon_struct_104_4_e718f752_for_egress *)(psVar13->cipher).ingress.aead;
      puVar14 = (psVar13->cipher).ingress.secret;
    }
    else {
      ctx = (psVar13->cipher).egress.key.aead;
      if (ctx != (ptls_aead_context_t *)0x0) {
        ptls_aead_free(ctx);
        ptls_cipher_free((psVar13->cipher).egress.key.header_protection);
        psVar13 = conn->application;
      }
      paVar16 = &(psVar13->cipher).egress;
      paVar7 = (anon_struct_112_4_eef7ff01_for_ingress *)&(psVar13->cipher).egress;
      puVar14 = (psVar13->cipher).egress.secret;
    }
    paVar15 = (anon_struct_216_2_55ab8ea6_for_cipher *)
              &((st_quicly_cipher_context_t *)&paVar7->header_protection)->header_protection;
    memcpy(puVar14,secret,ppVar12->hash->digest_size);
  }
  else if (epoch == 2) {
    if ((conn->handshake == (st_quicly_handshake_space_t *)0x0) &&
       (iVar8 = setup_handshake_space_and_flow(conn,2), iVar8 != 0)) {
      return iVar8;
    }
    psVar3 = conn->handshake;
    if (is_enc == 0) {
      paVar15 = (anon_struct_216_2_55ab8ea6_for_cipher *)&(psVar3->cipher).ingress.header_protection
      ;
      paVar16 = (anon_struct_104_4_e718f752_for_egress *)&psVar3->cipher;
    }
    else {
      paVar15 = (anon_struct_216_2_55ab8ea6_for_cipher *)&(psVar3->cipher).egress.header_protection;
      paVar16 = (anon_struct_104_4_e718f752_for_egress *)&(psVar3->cipher).egress;
    }
  }
  else {
    if (epoch != 1) {
      __assert_fail("!\"logic flaw\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0x103e,
                    "int update_traffic_key_cb(ptls_update_traffic_key_t *, ptls_t *, int, size_t, const void *)"
                   );
    }
    if (((uint)(conn->super).local.bidi.next_stream_id & 1 ^ is_enc) != 1) {
      __assert_fail("is_enc == quicly_is_client(conn)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0x101b,
                    "int update_traffic_key_cb(ptls_update_traffic_key_t *, ptls_t *, int, size_t, const void *)"
                   );
    }
    if ((conn->application == (st_quicly_application_space_t *)0x0) &&
       (iVar8 = setup_application_space(conn), iVar8 != 0)) {
      return iVar8;
    }
    psVar13 = conn->application;
    if (is_enc == 0) {
      paVar15 = &psVar13->cipher;
      paVar16 = (anon_struct_104_4_e718f752_for_egress *)((psVar13->cipher).ingress.aead + 1);
    }
    else {
      paVar16 = &(psVar13->cipher).egress;
      paVar15 = (anon_struct_216_2_55ab8ea6_for_cipher *)
                &(psVar13->cipher).egress.key.header_protection;
    }
  }
  psVar4 = ((conn->super).ctx)->crypto_engine;
  iVar8 = (*psVar4->setup_cipher)
                    (psVar4,conn,epoch,is_enc,(ptls_cipher_context_t **)paVar15,
                     (ptls_aead_context_t **)paVar16,ppVar12->aead,ppVar12->hash,secret);
  if ((iVar8 == 0) && (iVar8 = 0, is_enc != 0 && epoch == 3)) {
    conn->application->one_rtt_writable = 1;
    open_blocked_streams(conn,1);
    open_blocked_streams(conn,0);
    pqVar5 = (conn->super).ctx;
    if ((((conn->super).local.bidi.next_stream_id & 1) != 0) &&
       ((pqVar5->generate_resumption_token != (quicly_generate_resumption_token_t *)0x0 &&
        ((conn->super).state < QUICLY_STATE_CLOSING)))) {
      paVar1 = &(conn->egress).new_token;
      paVar1->generation = paVar1->generation + 1;
      puVar14 = &(conn->egress).pending_flows;
      *puVar14 = *puVar14 | 0x20;
    }
    if (pqVar5->cid_encryptor == (quicly_cid_encryptor_t *)0x0) {
      size = 1;
    }
    else {
      uVar6 = (conn->super).remote.transport_params.active_connection_id_limit;
      size = 4;
      if (uVar6 < 4) {
        size = uVar6;
      }
    }
    iVar9 = quicly_local_cid_set_size(&(conn->super).local.cid_set,size);
    iVar8 = 0;
    if (iVar9 != 0) {
      puVar14 = &(conn->egress).pending_flows;
      *puVar14 = *puVar14 | 0x80;
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

static int update_traffic_key_cb(ptls_update_traffic_key_t *self, ptls_t *tls, int is_enc, size_t epoch, const void *secret)
{
    quicly_conn_t *conn = *ptls_get_data_ptr(tls);
    ptls_context_t *tlsctx = ptls_get_context(tls);
    ptls_cipher_suite_t *cipher = ptls_get_cipher(tls);
    ptls_cipher_context_t **hp_slot;
    ptls_aead_context_t **aead_slot;
    int ret;
    static const char *log_labels[2][4] = {
        {NULL, "CLIENT_EARLY_TRAFFIC_SECRET", "CLIENT_HANDSHAKE_TRAFFIC_SECRET", "CLIENT_TRAFFIC_SECRET_0"},
        {NULL, NULL, "SERVER_HANDSHAKE_TRAFFIC_SECRET", "SERVER_TRAFFIC_SECRET_0"}};
    const char *log_label = log_labels[ptls_is_server(tls) == is_enc][epoch];

    QUICLY_PROBE(CRYPTO_UPDATE_SECRET, conn, conn->stash.now, is_enc, epoch, log_label,
                 QUICLY_PROBE_HEXDUMP(secret, cipher->hash->digest_size));

    if (tlsctx->log_event != NULL) {
        char hexbuf[PTLS_MAX_DIGEST_SIZE * 2 + 1];
        ptls_hexdump(hexbuf, secret, cipher->hash->digest_size);
        tlsctx->log_event->cb(tlsctx->log_event, tls, log_label, "%s", hexbuf);
    }

#define SELECT_CIPHER_CONTEXT(p)                                                                                                   \
    do {                                                                                                                           \
        hp_slot = &(p)->header_protection;                                                                                         \
        aead_slot = &(p)->aead;                                                                                                    \
    } while (0)

    switch (epoch) {
    case QUICLY_EPOCH_0RTT:
        assert(is_enc == quicly_is_client(conn));
        if (conn->application == NULL && (ret = setup_application_space(conn)) != 0)
            return ret;
        if (is_enc) {
            SELECT_CIPHER_CONTEXT(&conn->application->cipher.egress.key);
        } else {
            hp_slot = &conn->application->cipher.ingress.header_protection.zero_rtt;
            aead_slot = &conn->application->cipher.ingress.aead[1];
        }
        break;
    case QUICLY_EPOCH_HANDSHAKE:
        if (conn->handshake == NULL && (ret = setup_handshake_space_and_flow(conn, QUICLY_EPOCH_HANDSHAKE)) != 0)
            return ret;
        SELECT_CIPHER_CONTEXT(is_enc ? &conn->handshake->cipher.egress : &conn->handshake->cipher.ingress);
        break;
    case QUICLY_EPOCH_1RTT: {
        if (is_enc)
            if ((ret = apply_remote_transport_params(conn)) != 0)
                return ret;
        if (conn->application == NULL && (ret = setup_application_space(conn)) != 0)
            return ret;
        uint8_t *secret_store;
        if (is_enc) {
            if (conn->application->cipher.egress.key.aead != NULL)
                dispose_cipher(&conn->application->cipher.egress.key);
            SELECT_CIPHER_CONTEXT(&conn->application->cipher.egress.key);
            secret_store = conn->application->cipher.egress.secret;
        } else {
            hp_slot = &conn->application->cipher.ingress.header_protection.one_rtt;
            aead_slot = &conn->application->cipher.ingress.aead[0];
            secret_store = conn->application->cipher.ingress.secret;
        }
        memcpy(secret_store, secret, cipher->hash->digest_size);
    } break;
    default:
        assert(!"logic flaw");
        break;
    }

#undef SELECT_CIPHER_CONTEXT

    if ((ret = setup_cipher(conn, epoch, is_enc, hp_slot, aead_slot, cipher->aead, cipher->hash, secret)) != 0)
        return ret;

    if (epoch == QUICLY_EPOCH_1RTT && is_enc) {
        /* update states now that we have 1-RTT write key */
        conn->application->one_rtt_writable = 1;
        open_blocked_streams(conn, 1);
        open_blocked_streams(conn, 0);
        /* send the first resumption token using the 0.5 RTT window */
        if (!quicly_is_client(conn) && conn->super.ctx->generate_resumption_token != NULL) {
            ret = quicly_send_resumption_token(conn);
            assert(ret == 0);
        }

        /* schedule NEW_CONNECTION_IDs */
        size_t size = local_cid_size(conn);
        if (quicly_local_cid_set_size(&conn->super.local.cid_set, size))
            conn->egress.pending_flows |= QUICLY_PENDING_FLOW_CID_FRAME_BIT;
    }

    return 0;
}